

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ExecutePendingJob(JSRuntime *rt,JSContext **pctx)

{
  list_head *el;
  list_head *plVar1;
  JSValue v;
  int iVar2;
  int iVar3;
  undefined8 *in_RSI;
  long in_RDI;
  JSValue JVar4;
  int ret;
  int i;
  JSValue res;
  JSJobEntry *e;
  JSContext *ctx;
  void *in_stack_ffffffffffffffa8;
  JSValueUnion ctx_00;
  undefined4 in_stack_ffffffffffffffc0;
  int local_4;
  JSValue JVar5;
  
  iVar2 = list_empty((list_head *)(in_RDI + 0x120));
  if (iVar2 == 0) {
    el = *(list_head **)(in_RDI + 0x128);
    list_del(el);
    plVar1 = el[1].prev;
    JVar4 = (JSValue)(*(code *)el[1].next)(el[1].prev,*(undefined4 *)&el[2].prev,&el[2].next);
    JVar5 = JVar4;
    for (iVar2 = 0; iVar2 < *(int *)&el[2].prev; iVar2 = iVar2 + 1) {
      v.tag._0_4_ = in_stack_ffffffffffffffc0;
      v.u = (JSValueUnion)JVar5.tag;
      v.tag._4_4_ = iVar2;
      JS_FreeValue((JSContext *)JVar5.u.ptr,v);
    }
    iVar3 = JS_IsException(JVar4);
    ctx_00 = JVar5.u;
    if (iVar3 == 0) {
      local_4 = 1;
    }
    else {
      local_4 = -1;
    }
    JVar4.tag._0_4_ = local_4;
    JVar4.u = (JSValueUnion)JVar5.tag;
    JVar4.tag._4_4_ = iVar2;
    JS_FreeValue((JSContext *)ctx_00.ptr,JVar4);
    js_free((JSContext *)ctx_00.ptr,in_stack_ffffffffffffffa8);
    *in_RSI = plVar1;
  }
  else {
    *in_RSI = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int JS_ExecutePendingJob(JSRuntime *rt, JSContext **pctx)
{
    JSContext *ctx;
    JSJobEntry *e;
    JSValue res;
    int i, ret;

    if (list_empty(&rt->job_list)) {
        *pctx = NULL;
        return 0;
    }

    /* get the first pending job and execute it */
    e = list_entry(rt->job_list.next, JSJobEntry, link);
    list_del(&e->link);
    ctx = e->ctx;
    res = e->job_func(e->ctx, e->argc, (JSValueConst *)e->argv);
    for(i = 0; i < e->argc; i++)
        JS_FreeValue(ctx, e->argv[i]);
    if (JS_IsException(res))
        ret = -1;
    else
        ret = 1;
    JS_FreeValue(ctx, res);
    js_free(ctx, e);
    *pctx = ctx;
    return ret;
}